

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

int os_mkdir(char *dir,int create_parents)

{
  char *pcVar1;
  int iVar2;
  size_t __n;
  char *__dest;
  char *pcVar3;
  uint uVar4;
  char par [4096];
  char acStack_1028 [4096];
  
  if (*dir == '\0') {
    return 1;
  }
  __n = strlen(dir);
  __dest = (char *)operator_new__(__n + 1);
  memset(__dest,0,__n + 1);
  strncpy(__dest,dir,__n);
  pcVar3 = __dest + __n + 1;
  do {
    pcVar1 = pcVar3 + -2;
    pcVar3 = pcVar3 + -1;
  } while (*pcVar1 == '/');
  *pcVar3 = '\0';
  if ((create_parents != 0) && (pcVar3 = strchr(__dest,0x2f), pcVar3 != (char *)0x0)) {
    os_get_path_name(acStack_1028,0x1000,__dest);
    iVar2 = access(acStack_1028,0);
    if ((iVar2 != 0) && (iVar2 = os_mkdir(acStack_1028,1), iVar2 == 0)) {
      uVar4 = 0;
      goto LAB_00103a1d;
    }
  }
  iVar2 = mkdir(__dest,0x1ff);
  uVar4 = (uint)(iVar2 == 0);
LAB_00103a1d:
  operator_delete__(__dest);
  return uVar4;
}

Assistant:

int
os_mkdir( const char* dir, int create_parents )
{
    //assert(dir != 0);

    if (dir[0] == '\0')
        return true;

    // Copy the directory name to a new string so we can strip any trailing
    // path seperators.
    size_t len = strlen(dir);
    const auto tmp = std::make_unique<char[]>(len + 1);
    strncpy(tmp.get(), dir, len);
    while (tmp[len - 1] == OSPATHCHAR)
        --len;
    tmp[len] = '\0';

    // If we're creating intermediate diretories, and the path contains
    // multiple elements, recursively create the parent directories first.
    if (create_parents and strchr(tmp.get(), OSPATHCHAR) != 0) {
        char par[OSFNMAX];

        // Extract the parent path.
        os_get_path_name(par, sizeof(par), tmp.get());

        // If the parent doesn't already exist, create it recursively.
        if (osfacc(par) != 0 and not os_mkdir(par, true)) {
            return false;
        }
    }

    // Create the directory.
#if HAVE_MKDIR
    return mkdir(tmp.get(), S_IRWXU | S_IRWXG | S_IRWXO) == 0;
#elif HAVE_UNDERSCORE_MKDIR
    return _mkdir(tmp.get()) == 0;
#else
#   error "Neither mkdir() nor _mkdir() is available on this system."
#endif
}